

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  __m128 afVar20;
  binary_op_pow op;
  __m128 _a0;
  __m128 _p_2;
  __m256 _a0_avx;
  __m512 _a0_avx512;
  binary_op_pow local_1ad;
  int local_1ac;
  ulong local_1a8;
  Mat *local_1a0;
  Mat *local_198;
  Mat *local_190;
  ulong local_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float afStack_170 [2];
  float afStack_168 [6];
  float local_150 [2];
  float afStack_148 [2];
  __m512 local_140;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float afStack_e0 [2];
  float afStack_d8 [2];
  float afStack_d0 [2];
  float afStack_c8 [2];
  __m512 local_c0 [2];
  
  iVar8 = b->h;
  iVar4 = b->w;
  iVar1 = b->d;
  local_1a8 = (ulong)(uint)b->c;
  iVar2 = b->elempack;
  local_198 = a;
  local_190 = b;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar3 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)local_1a8) {
      local_188 = 0;
      local_1ac = iVar8 * iVar4 * iVar1 * iVar2;
      local_1a0 = c;
      do {
        iVar8 = local_1ac;
        pfVar9 = (float *)(local_190->cstep * local_188 * local_190->elemsize +
                          (long)local_190->data);
        pfVar10 = (float *)(local_1a0->cstep * local_188 * local_1a0->elemsize +
                           (long)local_1a0->data);
        local_140 = (__m512)vbroadcastss_avx512f(ZEXT416(*local_198->data));
        local_c0[0] = local_140;
        if (local_1ac < 0x10) {
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          do {
            uVar13 = *(undefined8 *)pfVar9;
            uVar12 = *(undefined8 *)(pfVar9 + 2);
            uVar14 = *(undefined8 *)(pfVar9 + 4);
            uVar15 = *(undefined8 *)(pfVar9 + 6);
            uVar16 = *(undefined8 *)(pfVar9 + 8);
            uVar17 = *(undefined8 *)(pfVar9 + 10);
            uVar18 = *(undefined8 *)(pfVar9 + 0xc);
            uVar19 = *(undefined8 *)(pfVar9 + 0xe);
            _local_100 = uVar13;
            _fStack_f8 = uVar12;
            _fStack_f0 = uVar14;
            _fStack_e8 = uVar15;
            afStack_e0 = (float  [2])uVar16;
            afStack_d8 = (float  [2])uVar17;
            afStack_d0 = (float  [2])uVar18;
            afStack_c8 = (float  [2])uVar19;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                      (&local_1ad,local_c0,(__m512 *)&local_100);
            *(undefined8 *)pfVar10 = uVar13;
            *(undefined8 *)(pfVar10 + 2) = uVar12;
            *(undefined8 *)(pfVar10 + 4) = uVar14;
            *(undefined8 *)(pfVar10 + 6) = uVar15;
            *(undefined8 *)(pfVar10 + 8) = uVar16;
            *(undefined8 *)(pfVar10 + 10) = uVar17;
            *(undefined8 *)(pfVar10 + 0xc) = uVar18;
            *(undefined8 *)(pfVar10 + 0xe) = uVar19;
            pfVar9 = pfVar9 + 0x10;
            pfVar10 = pfVar10 + 0x10;
            uVar6 = uVar7 + 0x10;
            iVar4 = uVar7 + 0x1f;
            uVar7 = uVar6;
          } while (iVar4 < iVar8);
        }
        fStack_fc = local_140[0];
        local_100 = local_140[0];
        fStack_f4 = local_140[0];
        fStack_f8 = local_140[0];
        fStack_ec = local_140[0];
        fStack_f0 = local_140[0];
        fStack_e4 = local_140[0];
        fStack_e8 = local_140[0];
        if ((int)(uVar6 | 7) < iVar8) {
          uVar7 = uVar6;
          do {
            uVar13 = *(undefined8 *)pfVar9;
            uVar12 = *(undefined8 *)(pfVar9 + 2);
            uVar14 = *(undefined8 *)(pfVar9 + 4);
            uVar15 = *(undefined8 *)(pfVar9 + 6);
            _local_180 = uVar13;
            _fStack_178 = uVar12;
            afStack_170 = (float  [2])uVar14;
            afStack_168._0_8_ = uVar15;
            BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                      (&local_1ad,(__m256 *)&local_100,(__m256 *)&local_180);
            *(undefined8 *)pfVar10 = uVar13;
            *(undefined8 *)(pfVar10 + 2) = uVar12;
            *(undefined8 *)(pfVar10 + 4) = uVar14;
            *(undefined8 *)(pfVar10 + 6) = uVar15;
            pfVar9 = pfVar9 + 8;
            pfVar10 = pfVar10 + 8;
            uVar6 = uVar7 + 8;
            iVar8 = uVar7 + 0xf;
            uVar7 = uVar6;
          } while (iVar8 < local_1ac);
        }
        fStack_17c = local_140[0];
        local_180 = local_140[0];
        fStack_174 = local_140[0];
        fStack_178 = local_140[0];
        uVar7 = uVar6;
        if ((int)(uVar6 | 3) < local_1ac) {
          do {
            local_150 = *(float (*) [2])pfVar9;
            uVar13 = *(undefined8 *)(pfVar9 + 2);
            afStack_148 = (float  [2])uVar13;
            afVar20 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                (&local_1ad,(__m128 *)&local_180,(__m128 *)local_150);
            *(long *)pfVar10 = afVar20._0_8_;
            *(undefined8 *)(pfVar10 + 2) = uVar13;
            pfVar9 = pfVar9 + 4;
            pfVar10 = pfVar10 + 4;
            uVar6 = uVar7 + 4;
            iVar8 = uVar7 + 7;
            uVar7 = uVar6;
          } while (iVar8 < local_1ac);
        }
        iVar8 = local_1ac - uVar6;
        if ((int)uVar6 < local_1ac) {
          lVar5 = 0;
          do {
            fVar11 = powf(local_140[0],pfVar9[lVar5]);
            pfVar10[lVar5] = fVar11;
            lVar5 = lVar5 + 1;
          } while (iVar8 != (int)lVar5);
        }
        local_188 = local_188 + 1;
      } while (local_188 != local_1a8);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}